

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O0

WebPMuxError AddDataToChunkList(WebPData *data,int copy_data,uint32_t tag,WebPChunk **chunk_list)

{
  WebPMuxError err;
  WebPChunk chunk;
  uint32_t in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  WebPData *in_stack_ffffffffffffffc0;
  WebPChunk *in_stack_ffffffffffffffc8;
  WebPMuxError local_4;
  
  ChunkInit((WebPChunk *)0x1a4060);
  local_4 = ChunkAssignData(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                            in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  if ((local_4 == WEBP_MUX_OK) &&
     (local_4 = ChunkSetHead(in_stack_ffffffffffffffc8,(WebPChunk **)in_stack_ffffffffffffffc0),
     local_4 == WEBP_MUX_OK)) {
    local_4 = WEBP_MUX_OK;
  }
  else {
    ChunkRelease((WebPChunk *)CONCAT44(local_4,in_stack_ffffffffffffffb8));
  }
  return local_4;
}

Assistant:

static WebPMuxError AddDataToChunkList(
    const WebPData* const data, int copy_data, uint32_t tag,
    WebPChunk** chunk_list) {
  WebPChunk chunk;
  WebPMuxError err;
  ChunkInit(&chunk);
  err = ChunkAssignData(&chunk, data, copy_data, tag);
  if (err != WEBP_MUX_OK) goto Err;
  err = ChunkSetHead(&chunk, chunk_list);
  if (err != WEBP_MUX_OK) goto Err;
  return WEBP_MUX_OK;
 Err:
  ChunkRelease(&chunk);
  return err;
}